

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void freeIndexInfo(sqlite3 *db,sqlite3_index_info *pIdxInfo)

{
  int *in_RSI;
  int i;
  HiddenIndexInfo *pHidden;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *in_RSI; iVar1 = iVar1 + 1) {
    sqlite3ValueFree((sqlite3_value *)0x205bec);
    (in_RSI + (long)iVar1 * 2 + 0x20)[0] = 0;
    (in_RSI + (long)iVar1 * 2 + 0x20)[1] = 0;
  }
  freeIdxStr((sqlite3_index_info *)0x205c16);
  sqlite3DbFree((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void freeIndexInfo(sqlite3 *db, sqlite3_index_info *pIdxInfo){
  HiddenIndexInfo *pHidden;
  int i;
  assert( pIdxInfo!=0 );
  pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  assert( pHidden->pParse!=0 );
  assert( pHidden->pParse->db==db );
  for(i=0; i<pIdxInfo->nConstraint; i++){
    sqlite3ValueFree(pHidden->aRhs[i]); /* IMP: R-14553-25174 */
    pHidden->aRhs[i] = 0;
  }
  freeIdxStr(pIdxInfo);
  sqlite3DbFree(db, pIdxInfo);
}